

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall Catch::Approx::toString_abi_cxx11_(string *__return_storage_ptr__,Approx *this)

{
  ostream *poVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  char *this_00;
  ReusableStringStream rss;
  ReusableStringStream local_48;
  string local_38;
  
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
  local_48.m_index = sVar3;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar1 = (ostream *)
           (pSVar2->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar3].m_ptr;
  this_00 = "Approx( ";
  local_48.m_oss = poVar1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Approx( ",8);
  StringMaker<double,void>::convert_abi_cxx11_
            (&local_38,(StringMaker<double,void> *)this_00,this->m_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," )",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify(m_value) << " )";
        return rss.str();
    }